

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O2

unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneLibC>_>
 __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::Make(TimeZoneLibC *this,string *name)

{
  TimeZoneLibC *this_00;
  
  this_00 = (TimeZoneLibC *)operator_new(0x10);
  TimeZoneLibC(this_00,name);
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)this_00;
  return (__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneLibC>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneLibC>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneLibC> TimeZoneLibC::Make(const std::string& name) {
  return std::unique_ptr<TimeZoneLibC>(new TimeZoneLibC(name));
}